

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_send_head(mg_connection *c,int status_code,int64_t content_length,char *extra_headers)

{
  char *fmt;
  
  mg_send_response_line(c,status_code,extra_headers);
  if (content_length < 0) {
    fmt = "%s";
    content_length = (int64_t)"Transfer-Encoding: chunked\r\n";
  }
  else {
    fmt = "Content-Length: %ld\r\n";
  }
  mg_printf(c,fmt,content_length);
  mg_send(c,"\r\n",2);
  return;
}

Assistant:

void mg_send_head(struct mg_connection *c, int status_code,
                  int64_t content_length, const char *extra_headers) {
    mg_send_response_line(c, status_code, extra_headers);
    if (content_length < 0) {
        mg_printf(c, "%s", "Transfer-Encoding: chunked\r\n");
    } else {
        mg_printf(c, "Content-Length: %" INT64_FMT "\r\n", content_length);
    }
    mg_send(c, "\r\n", 2);
}